

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFunctions.h
# Opt level: O0

void Assimp::MDL::HalfLife::log_warning_limit_exceeded<256>
               (string *subject,int current_amount,string *direct_object)

{
  Logger *this;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *direct_object_local;
  string *psStack_10;
  int current_amount_local;
  string *subject_local;
  
  local_20 = direct_object;
  direct_object_local._4_4_ = current_amount;
  psStack_10 = subject;
  this = DefaultLogger::get();
  std::operator+(&local_120,"[Half-Life 1 MDL] ",psStack_10);
  std::operator+(&local_100,&local_120," has ");
  std::__cxx11::to_string(&local_150,direct_object_local._4_4_);
  std::operator+(&local_e0,&local_100,&local_150);
  std::operator+(&local_c0,&local_e0," ");
  std::operator+(&local_a0,&local_c0,local_20);
  std::operator+(&local_80,&local_a0,", which exceeds the limit (");
  std::__cxx11::to_string(&local_170,0x100);
  std::operator+(&local_60,&local_80,&local_170);
  std::operator+(&local_40,&local_60,")");
  Logger::warn(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  return;
}

Assistant:

static inline void log_warning_limit_exceeded(
    const std::string &subject, int current_amount,
    const std::string &direct_object) {

    ASSIMP_LOG_WARN(MDL_HALFLIFE_LOG_HEADER
        + subject
        + " has "
        + std::to_string(current_amount) + " "
        + direct_object
        + ", which exceeds the limit ("
        + std::to_string(LIMIT)
        + ")");
}